

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

string * __thiscall
helics::CoreBroker::query_abi_cxx11_
          (string *__return_storage_ptr__,CoreBroker *this,string_view target,string_view queryStr,
          HelicsSequencingModes mode)

{
  BrokerBase *this_00;
  atomic<int> *paVar1;
  GlobalFederateId GVar2;
  string_view request;
  string_view request_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar3;
  string *string;
  int iVar4;
  action_t aVar5;
  ActionMessage *this_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_09;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  queryResult;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  string_view queryStr_local;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  queryResult_1;
  ActionMessage querycmd;
  
  queryStr_local._M_str = queryStr._M_str;
  queryStr_local._M_len = queryStr._M_len;
  this_01 = (ActionMessage *)&queryResult;
  this_00 = &this->super_BrokerBase;
  if ((this->super_BrokerBase).brokerState._M_i < TERMINATING) {
    GVar2.gid = (this->super_BrokerBase).global_id._M_i.gid;
    __y_01._M_str = "broker";
    __y_01._M_len = 6;
    bVar3 = std::operator==(target,__y_01);
    if ((bVar3) ||
       (__y_02._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p,
       __y_02._M_len = (this->super_BrokerBase).identifier._M_string_length,
       bVar3 = std::operator==(target,__y_02), target._M_len == 0 || bVar3)) {
      request_00._M_str = queryStr_local._M_str;
      request_00._M_len = queryStr_local._M_len;
      quickBrokerQueries_abi_cxx11_((string *)&queryResult,this,request_00);
      if (queryResult.
          super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        __x_00._M_str = queryStr_local._M_str;
        __x_00._M_len = queryStr_local._M_len;
        __y_04._M_str = "address";
        __y_04._M_len = 7;
        bVar3 = std::operator==(__x_00,__y_04);
        if (!bVar3) {
          aVar5 = cmd_broker_query_ordered;
          if (mode == HELICS_SEQUENCING_MODE_FAST) {
            aVar5 = cmd_broker_query;
          }
          ActionMessage::ActionMessage(&querycmd,aVar5);
          querycmd.source_id.gid = GVar2.gid;
          LOCK();
          paVar1 = &this->queryCounter;
          iVar4 = (paVar1->super___atomic_base<int>)._M_i;
          (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
          UNLOCK();
          iVar4 = iVar4 + 1;
          querycmd.messageID = iVar4;
          querycmd.dest_id.gid = GVar2.gid;
          SmallBuffer::operator=(&querycmd.payload,&queryStr_local);
          gmlc::concurrency::
          DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::getFuture((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&queryResult_1,(int)&this->activeQueries);
          BrokerBase::addActionMessage(this_00,&querycmd);
          std::
          future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          get((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __return_storage_ptr__,
              (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&queryResult_1);
          gmlc::concurrency::
          DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::finishedWithValue(&this->activeQueries,iVar4);
          CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&queryResult_1.
                      super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          ActionMessage::~ActionMessage(&querycmd);
          goto LAB_002c34dc;
        }
        string = getAddress_abi_cxx11_(this);
        generateJsonQuotedString((string *)&querycmd,string);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&queryResult,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&querycmd);
        std::__cxx11::string::~string((string *)&querycmd);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)queryResult.
               super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr == &local_118) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]);
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_118._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p =
               (pointer)queryResult.
                        super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_state.
                        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]);
        }
        __return_storage_ptr__->_M_string_length =
             (size_type)
             queryResult.
             super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)queryResult.
               super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr == &local_118) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]);
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_118._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p =
               (pointer)queryResult.
                        super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_state.
                        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]);
        }
        __return_storage_ptr__->_M_string_length =
             (size_type)
             queryResult.
             super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      }
      queryResult.
      super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)&local_118;
      queryResult.
      super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_118._M_local_buf[0] = '\0';
      this_01 = (ActionMessage *)&queryResult;
      goto LAB_002c34dc;
    }
    __y_07._M_str = "parent";
    __y_07._M_len = 6;
    bVar3 = std::operator==(target,__y_07);
    if (!bVar3) {
      __y_08._M_str = "root";
      __y_08._M_len = 4;
      bVar3 = std::operator==(target,__y_08);
      if ((bVar3) ||
         (__y_09._M_str = "rootbroker", __y_09._M_len = 10, bVar3 = std::operator==(target,__y_09),
         bVar3)) {
        aVar5 = cmd_broker_query_ordered;
        if (mode == HELICS_SEQUENCING_MODE_FAST) {
          aVar5 = cmd_broker_query;
        }
        ActionMessage::ActionMessage(&querycmd,aVar5);
        querycmd.source_id.gid = GVar2.gid;
        LOCK();
        paVar1 = &this->queryCounter;
        iVar4 = (paVar1->super___atomic_base<int>)._M_i;
        (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
        UNLOCK();
        iVar4 = iVar4 + 1;
        querycmd.messageID = iVar4;
        SmallBuffer::operator=(&querycmd.payload,&queryStr_local);
        gmlc::concurrency::
        DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::getFuture((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&queryResult,(int)&this->activeQueries);
        transmitToParent(this,&querycmd);
        std::
        future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        get((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __return_storage_ptr__,
            (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&queryResult);
        gmlc::concurrency::
        DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::finishedWithValue(&this->activeQueries,iVar4);
      }
      else {
        aVar5 = cmd_query_ordered;
        if (mode == HELICS_SEQUENCING_MODE_FAST) {
          aVar5 = cmd_query;
        }
        ActionMessage::ActionMessage(&querycmd,aVar5);
        querycmd.source_id.gid = GVar2.gid;
        LOCK();
        paVar1 = &this->queryCounter;
        iVar4 = (paVar1->super___atomic_base<int>)._M_i;
        (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
        UNLOCK();
        iVar4 = iVar4 + 1;
        querycmd.messageID = iVar4;
        SmallBuffer::operator=(&querycmd.payload,&queryStr_local);
        ActionMessage::setStringData(&querycmd,(string_view)target);
        gmlc::concurrency::
        DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::getFuture((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&queryResult,(int)&this->activeQueries);
        transmitToParent(this,&querycmd);
        std::
        future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        get((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __return_storage_ptr__,
            (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&queryResult);
        gmlc::concurrency::
        DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::finishedWithValue(&this->activeQueries,iVar4);
      }
LAB_002c3588:
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&queryResult.
                  super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ActionMessage::~ActionMessage(&querycmd);
      return __return_storage_ptr__;
    }
    if ((this->super_BrokerBase).field_0x294 != '\x01') {
      aVar5 = cmd_broker_query_ordered;
      if (mode == HELICS_SEQUENCING_MODE_FAST) {
        aVar5 = cmd_broker_query;
      }
      ActionMessage::ActionMessage(&querycmd,aVar5);
      querycmd.source_id.gid = GVar2.gid;
      LOCK();
      paVar1 = &this->queryCounter;
      iVar4 = (paVar1->super___atomic_base<int>)._M_i;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      querycmd.messageID = iVar4 + 1;
      SmallBuffer::operator=(&querycmd.payload,&queryStr_local);
      gmlc::concurrency::
      DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::getFuture((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&queryResult,(int)&this->activeQueries);
      BrokerBase::addActionMessage(this_00,&querycmd);
      std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::get((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __return_storage_ptr__,
            (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&queryResult);
      gmlc::concurrency::
      DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::finishedWithValue(&this->activeQueries,querycmd.messageID);
      goto LAB_002c3588;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&querycmd,"broker has no parent",(allocator<char> *)&queryResult);
    generateJsonErrorResponse((string *)__return_storage_ptr__,NOT_FOUND,(string *)&querycmd);
  }
  else {
    __y._M_str = "broker";
    __y._M_len = 6;
    bVar3 = std::operator==(target,__y);
    if ((((bVar3) ||
         (__y_00._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p,
         __y_00._M_len = (this->super_BrokerBase).identifier._M_string_length,
         bVar3 = std::operator==(target,__y_00), target._M_len == 0 || bVar3)) ||
        ((__y_05._M_str = "root", __y_05._M_len = 4, bVar3 = std::operator==(target,__y_05), bVar3
         && (((this->super_BrokerBase).field_0x293 & 1) != 0)))) ||
       ((__y_06._M_str = "federation", __y_06._M_len = 10, bVar3 = std::operator==(target,__y_06),
        bVar3 && (((this->super_BrokerBase).field_0x293 & 1) != 0)))) {
      request._M_str = queryStr_local._M_str;
      request._M_len = queryStr_local._M_len;
      quickBrokerQueries_abi_cxx11_((string *)&querycmd,this,request);
      if (querycmd._8_8_ == 0) {
        __x._M_str = queryStr_local._M_str;
        __x._M_len = queryStr_local._M_len;
        __y_03._M_str = "logs";
        __y_03._M_len = 4;
        bVar3 = std::operator==(__x,__y_03);
        if (!bVar3) {
          std::__cxx11::string::~string((string *)&querycmd);
          goto LAB_002c32ae;
        }
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&queryResult,(nullptr_t)0x0);
        BrokerBase::addBaseInformation
                  (this_00,(json *)&queryResult,(bool)(~(this->super_BrokerBase).field_0x293 & 1));
        bufferToJson(&((this->super_BrokerBase).mLogManager.
                       super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      mLogBuffer,(json *)&queryResult);
        fileops::generateJsonString((string *)__return_storage_ptr__,(json *)&queryResult,true);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)&queryResult);
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((GlobalFederateId *)querycmd._0_8_ == &querycmd.dest_id) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT44(querycmd.dest_handle.hid,querycmd.dest_id.gid);
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = querycmd._24_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)querycmd._0_8_;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT44(querycmd.dest_handle.hid,querycmd.dest_id.gid);
        }
        __return_storage_ptr__->_M_string_length = querycmd._8_8_;
        querycmd.source_id.gid = 0;
        querycmd.source_handle.hid = 0;
        querycmd.dest_id.gid = querycmd.dest_id.gid & 0xffffff00;
        querycmd._0_8_ = &querycmd.dest_id;
      }
    }
    else {
LAB_002c32ae:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&querycmd,"Broker has terminated",(allocator<char> *)&queryResult);
      generateJsonErrorResponse((string *)__return_storage_ptr__,DISCONNECTED,(string *)&querycmd);
    }
  }
  this_01 = &querycmd;
LAB_002c34dc:
  std::__cxx11::string::~string((string *)this_01);
  return __return_storage_ptr__;
}

Assistant:

std::string CoreBroker::query(std::string_view target,
                              std::string_view queryStr,
                              HelicsSequencingModes mode)
{
    if (getBrokerState() >= BrokerState::TERMINATING) {
        if (target == "broker" || target == getIdentifier() || target.empty() ||
            (target == "root" && _isRoot) || (target == "federation" && _isRoot)) {
            auto res = quickBrokerQueries(queryStr);
            if (!res.empty()) {
                return res;
            }
            if (queryStr == "logs") {
                nlohmann::json base;
                addBaseInformation(base, !isRoot());
                bufferToJson(mLogManager->getLogBuffer(), base);
                return fileops::generateJsonString(base);
            }
        }
        return generateJsonErrorResponse(JsonErrorCodes::DISCONNECTED, "Broker has terminated");
    }
    auto gid = global_id.load();
    if (target == "broker" || target == getIdentifier() || target.empty()) {
        auto res = quickBrokerQueries(queryStr);
        if (!res.empty()) {
            return res;
        }
        if (queryStr == "address") {
            res = generateJsonQuotedString(getAddress());
            return res;
        }
        ActionMessage querycmd(mode == HELICS_SEQUENCING_MODE_FAST ? CMD_BROKER_QUERY :
                                                                     CMD_BROKER_QUERY_ORDERED);
        querycmd.source_id = querycmd.dest_id = gid;
        auto index = ++queryCounter;
        querycmd.messageID = index;
        querycmd.payload = queryStr;
        auto queryResult = activeQueries.getFuture(index);
        addActionMessage(std::move(querycmd));
        auto ret = queryResult.get();
        activeQueries.finishedWithValue(index);
        return ret;
    }
    if (target == "parent") {
        if (isRootc) {
            return generateJsonErrorResponse(JsonErrorCodes::NOT_FOUND,
                                             "broker has no parent");  // LCOV_EXCL_LINE
        }
        ActionMessage querycmd(mode == HELICS_SEQUENCING_MODE_FAST ? CMD_BROKER_QUERY :
                                                                     CMD_BROKER_QUERY_ORDERED);
        querycmd.source_id = gid;
        querycmd.messageID = ++queryCounter;
        querycmd.payload = queryStr;
        auto queryResult = activeQueries.getFuture(querycmd.messageID);
        addActionMessage(querycmd);
        auto ret = queryResult.get();
        activeQueries.finishedWithValue(querycmd.messageID);
        return ret;
    }
    if ((target == "root") || (target == "rootbroker")) {
        ActionMessage querycmd(mode == HELICS_SEQUENCING_MODE_FAST ? CMD_BROKER_QUERY :
                                                                     CMD_BROKER_QUERY_ORDERED);
        querycmd.source_id = gid;
        auto index = ++queryCounter;
        querycmd.messageID = index;
        querycmd.payload = queryStr;
        auto queryResult = activeQueries.getFuture(querycmd.messageID);
        transmitToParent(std::move(querycmd));

        auto ret = queryResult.get();
        activeQueries.finishedWithValue(index);
        return ret;
    }

    ActionMessage querycmd(mode == HELICS_SEQUENCING_MODE_FAST ? CMD_QUERY : CMD_QUERY_ORDERED);
    querycmd.source_id = gid;
    auto index = ++queryCounter;
    querycmd.messageID = index;
    querycmd.payload = queryStr;
    querycmd.setStringData(target);
    auto queryResult = activeQueries.getFuture(querycmd.messageID);
    transmitToParent(std::move(querycmd));

    auto ret = queryResult.get();
    activeQueries.finishedWithValue(index);
    return ret;
}